

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::WriteModelItem(MemoryWriter *wrt,QuadAndLinTerms *qlt,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  size_t sVar1;
  char *in_RDX;
  QuadAndLinTerms *in_RSI;
  BasicWriter<char> *in_RDI;
  ItemNamer *in_stack_00000090;
  QuadTerms *in_stack_00000098;
  MemoryWriter *in_stack_000000a0;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  BasicWriter<char> *in_stack_ffffffffffffffc0;
  BasicWriter<char> *in_stack_ffffffffffffffe0;
  
  QuadAndLinTerms::GetLinTerms(in_RSI);
  WriteModelItem(wrt,&qlt->super_LinTerms,vnam);
  QuadAndLinTerms::GetQPTerms(in_RSI);
  sVar1 = QuadTerms::size((QuadTerms *)0x50b78b);
  if (sVar1 != 0) {
    QuadAndLinTerms::GetLinTerms(in_RSI);
    sVar1 = LinTerms::size((LinTerms *)0x50b7a7);
    if (sVar1 != 0) {
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffffc0,
                 (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      value.size_ = (size_t)in_RSI;
      value.data_ = in_RDX;
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffe0,value);
    }
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    QuadAndLinTerms::GetQPTerms(in_RSI);
    WriteModelItem(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    fmt::BasicWriter<char>::operator<<(in_RDI,in_stack_ffffffffffffffbf);
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const QuadAndLinTerms& qlt,
                    ItemNamer& vnam) {
  WriteModelItem(wrt, qlt.GetLinTerms(), vnam);
  if (qlt.GetQPTerms().size()) {
    if (qlt.GetLinTerms().size())
      wrt << " + ";
    wrt << '(';
    WriteModelItem(wrt, qlt.GetQPTerms(), vnam);
    wrt << ')';
  }
}